

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmListFileBacktrace *file;
  pointer *this_00;
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  cmMessenger *messenger;
  iterator iVar5;
  cmListFileFunction *func_1;
  pointer __lhs;
  pointer ppcVar6;
  cmListFileFunction *func;
  pointer pcVar7;
  int local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  cmListFile listFile;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  pointer pcStack_b8;
  pointer local_b0;
  pointer pcStack_a8;
  string currentStart;
  string filesDir;
  BuildsystemFileScope scope;
  
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&subdirs);
  std::__cxx11::string::string((string *)&currentStart,(string *)psVar4);
  std::__cxx11::string::append((char *)&currentStart);
  file = &this->Backtrace;
  cmListFileBacktrace::Push((cmListFileBacktrace *)&subdirs,(string *)file);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)file,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&subdirs)
  ;
  this_00 = &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  BuildsystemFileScope::BuildsystemFileScope(&scope,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&subdirs);
  std::__cxx11::string::string((string *)&filesDir,(string *)psVar4);
  std::__cxx11::string::append((char *)&filesDir);
  cmsys::SystemTools::MakeDirectory(&filesDir,(mode_t *)0x0);
  bVar3 = cmsys::SystemTools::FileExists(&currentStart,true);
  if (!bVar3) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                  ,0x601,"void cmMakefile::Configure()");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdirs,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&local_138);
  AddDefinition(this,(string *)&subdirs,currentStart._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&subdirs);
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  messenger = GetMessenger(this);
  bVar3 = cmListFile::ParseFile(&listFile,currentStart._M_dataplus._M_p,messenger,file);
  if (!bVar3) goto LAB_0027918b;
  bVar3 = IsRootMakefile(this);
  pcVar2 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar7 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar3) {
    do {
      if (pcVar7 == pcVar2) {
        if (0x1d < (ulong)(((long)listFile.Functions.
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)listFile.Functions.
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x60))
        goto LAB_00278fe6;
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)subdirs.
                              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"project",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"set",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"if",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"endif",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"else",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"elseif",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"add_executable",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"add_library",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"target_link_libraries",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"option",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"message",(allocator<char> *)&local_13c);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        pcVar2 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        pcVar7 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        goto LAB_00278fc3;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pcVar7,"cmake_minimum_required");
      __lhs = listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
      pcVar7 = pcVar7 + 1;
      pcVar1 = listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar3);
    goto LAB_00279057;
  }
  goto LAB_00279114;
  while( true ) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&subdirs,(key_type *)pcVar7);
    pcVar7 = pcVar7 + 1;
    if (iVar5._M_node == (_Base_ptr)this_00) break;
LAB_00278fc3:
    if (pcVar7 == pcVar2) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&subdirs);
      __lhs = listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
      pcVar1 = listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      goto LAB_00279057;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subdirs);
LAB_00278fe6:
  this->CheckCMP0000 = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdirs,"2.4",(allocator<char> *)&local_13c);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  cmPolicies::ApplyPolicyVersion(this,(string *)&subdirs,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&subdirs);
  __lhs = listFile.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_start;
  pcVar1 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
LAB_00279057:
  do {
    if (__lhs == pcVar1) {
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      pcStack_b8 = (pointer)0x0;
      local_b0 = (pointer)0x0;
      pcStack_a8 = (pointer)0x0;
      std::__cxx11::string::assign((char *)&subdirs);
      local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffff00000000;
      local_13c = 0;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const(&)[8],cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&pcStack_b8,
                 (char (*) [8])0x3e5533,(Delimiter *)&local_138,&local_13c);
      local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffff00000000;
      local_13c = 0;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const(&)[35],cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&pcStack_b8,
                 (char (*) [35])"__CMAKE_INJECTED_PROJECT_COMMAND__",(Delimiter *)&local_138,
                 &local_13c);
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                (&listFile.Functions,
                 (const_iterator)
                 listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start,(value_type *)&subdirs);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&subdirs);
      break;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"project");
    __lhs = __lhs + 1;
  } while (!bVar3);
LAB_00279114:
  ReadListFile(this,&listFile,&currentStart);
  bVar3 = cmSystemTools::GetFatalErrorOccured();
  if (bVar3) {
    scope.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            (&subdirs,&this->UnConfiguredDirectories);
  for (ppcVar6 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar6 !=
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
    cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar6)->StateSnapshot);
    ConfigureSubDirectory(this,*ppcVar6);
  }
  AddCMakeDependFilesFromUser(this);
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
LAB_0027918b:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&listFile.Functions)
  ;
  std::__cxx11::string::~string((string *)&filesDir);
  BuildsystemFileScope::~BuildsystemFileScope(&scope);
  std::__cxx11::string::~string((string *)&currentStart);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += "/CMakeFiles";
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (allowedCommands.find(func.Name.Lower) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4", std::string());
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      cmListFileFunction project;
      project.Name.Lower = "project";
      project.Arguments.emplace_back("Project", cmListFileArgument::Unquoted,
                                     0);
      project.Arguments.emplace_back("__CMAKE_INJECTED_PROJECT_COMMAND__",
                                     cmListFileArgument::Unquoted, 0);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}